

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O1

void brotli::WriteHuffmanTree
               (uint8_t *depth,size_t length,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tree,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *extra_bits_data)

{
  uint8_t value;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint8_t previous_value;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t repetitions;
  size_t sVar9;
  size_t sVar10;
  bool bVar11;
  
  sVar10 = length;
  if (length != 0) {
    do {
      if (depth[sVar10 - 1] != '\0') goto LAB_00183b01;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
    sVar10 = 0;
  }
LAB_00183b01:
  if (length < 0x33) {
    bVar11 = false;
    bVar1 = false;
  }
  else {
    if (sVar10 == 0) {
      uVar3 = 2;
      uVar6 = 0;
      uVar7 = 2;
      uVar4 = 0;
    }
    else {
      lVar5 = 1;
      uVar4 = 0;
      uVar7 = 0;
      lVar2 = 1;
      uVar6 = 0;
      do {
        uVar8 = 1;
        uVar3 = uVar8;
        if (uVar7 + 1 < sVar10) {
          do {
            uVar3 = uVar8;
            if (depth[uVar8 + uVar7] != depth[uVar7]) break;
            uVar8 = uVar8 + 1;
            uVar3 = sVar10 - uVar7;
          } while (sVar10 - uVar7 != uVar8);
        }
        bVar11 = depth[uVar7] == '\0';
        lVar2 = lVar2 + (ulong)(bVar11 && 2 < uVar3);
        uVar8 = 0;
        if (bVar11 && 2 < uVar3) {
          uVar8 = uVar3;
        }
        uVar4 = uVar4 + uVar8;
        uVar8 = 0;
        if (3 < uVar3 && !bVar11) {
          uVar8 = uVar3;
        }
        uVar6 = uVar6 + uVar8;
        lVar5 = lVar5 + (ulong)(3 < uVar3 && !bVar11);
        uVar7 = uVar7 + uVar3;
      } while (uVar7 < sVar10);
      uVar7 = lVar5 * 2;
      uVar3 = lVar2 * 2;
    }
    bVar11 = uVar7 < uVar6;
    bVar1 = uVar3 < uVar4;
  }
  if (sVar10 != 0) {
    previous_value = '\b';
    uVar7 = 0;
    do {
      value = depth[uVar7];
      repetitions = 1;
      if (value == '\0') {
        if (bVar1) goto LAB_00183c10;
      }
      else if (bVar11) {
LAB_00183c10:
        if (uVar7 + 1 < sVar10) {
          sVar9 = repetitions;
          do {
            repetitions = sVar9;
            if (depth[sVar9 + uVar7] != value) break;
            sVar9 = sVar9 + 1;
            repetitions = sVar10 - uVar7;
          } while (sVar10 - uVar7 != sVar9);
        }
      }
      if (value == '\0') {
        WriteHuffmanTreeRepetitionsZeros(repetitions,tree,extra_bits_data);
      }
      else {
        WriteHuffmanTreeRepetitions(previous_value,value,repetitions,tree,extra_bits_data);
        previous_value = value;
      }
      uVar7 = uVar7 + repetitions;
    } while (uVar7 < sVar10);
  }
  return;
}

Assistant:

void WriteHuffmanTree(const uint8_t* depth,
                      size_t length,
                      std::vector<uint8_t> *tree,
                      std::vector<uint8_t> *extra_bits_data) {
  uint8_t previous_value = 8;

  // Throw away trailing zeros.
  size_t new_length = length;
  for (size_t i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  // First gather statistics on if it is a good idea to do rle.
  bool use_rle_for_non_zero = false;
  bool use_rle_for_zero = false;
  if (length > 50) {
    // Find rle coding for longer codes.
    // Shorter codes seem not to benefit from rle.
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  // Actual rle coding.
  for (size_t i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      for (size_t k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      WriteHuffmanTreeRepetitionsZeros(reps, tree, extra_bits_data);
    } else {
      WriteHuffmanTreeRepetitions(previous_value,
                                  value, reps, tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}